

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderArrowDockMenu(ImDrawList *draw_list,ImVec2 p_min,float sz,ImU32 col)

{
  ImVec2 half_sz;
  float in_ESI;
  ImVec2 in_RDI;
  ImVec2 draw_list_00;
  float in_XMM1_Da;
  ImVec2 *this;
  ImVec2 *this_00;
  ImVec2 *p_max;
  ImVec2 *in_stack_ffffffffffffff98;
  float fVar1;
  undefined4 in_stack_ffffffffffffffa4;
  float fVar2;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  ImVec2 pos;
  ImVec2 local_8;
  ImDrawCornerFlags rounding_corners;
  
  this = (ImVec2 *)&stack0xffffffffffffffd8;
  pos = in_RDI;
  ImVec2::ImVec2(this,in_XMM1_Da * 0.1,in_XMM1_Da * 0.15);
  p_max = &local_8;
  draw_list_00 = ::operator+(this,(ImVec2 *)0x1efd6e);
  fVar1 = 0.3;
  this_00 = &local_38;
  ImVec2::ImVec2(this_00,in_XMM1_Da * 0.7,in_XMM1_Da * 0.3);
  rounding_corners = (ImDrawCornerFlags)((ulong)this_00 >> 0x20);
  local_30 = ::operator+(this,(ImVec2 *)0x1efdb9);
  ImDrawList::AddRectFilled
            ((ImDrawList *)CONCAT44(in_stack_ffffffffffffffa4,fVar1),in_stack_ffffffffffffff98,p_max
             ,(ImU32)in_RDI.y,in_RDI.x,rounding_corners);
  fVar2 = 0.4;
  ImVec2::ImVec2(&local_48,in_XMM1_Da * 0.4,in_XMM1_Da * 0.85);
  local_40 = ::operator+(this,(ImVec2 *)0x1efe2f);
  ImVec2::ImVec2(&local_50,in_XMM1_Da * fVar1,in_XMM1_Da * fVar2);
  half_sz.y = in_XMM1_Da;
  half_sz.x = in_ESI;
  RenderArrowPointingAt
            ((ImDrawList *)draw_list_00,pos,half_sz,(ImGuiDir)in_stack_ffffffffffffffdc,
             (ImU32)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void ImGui::RenderArrowDockMenu(ImDrawList* draw_list, ImVec2 p_min, float sz, ImU32 col)
{
    draw_list->AddRectFilled(p_min + ImVec2(sz * 0.10f, sz * 0.15f), p_min + ImVec2(sz * 0.70f, sz * 0.30f), col);
    RenderArrowPointingAt(draw_list, p_min + ImVec2(sz * 0.40f, sz * 0.85f), ImVec2(sz * 0.30f, sz * 0.40f), ImGuiDir_Down, col);
}